

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_s.cpp
# Opt level: O1

float snrm2(int n,float *x,int incx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = 0.0;
  if (0 < incx && 0 < n) {
    if (n == 1) {
      return ABS(*x);
    }
    if (n < 1) {
      fVar1 = 1.0;
      fVar3 = 0.0;
    }
    else {
      fVar1 = 1.0;
      fVar3 = 0.0;
      do {
        fVar2 = *x;
        if ((fVar2 != 0.0) || (NAN(fVar2))) {
          fVar2 = ABS(fVar2);
          if (fVar2 <= fVar3) {
            fVar1 = fVar1 + (fVar2 / fVar3) * (fVar2 / fVar3);
          }
          else {
            fVar1 = fVar1 * (fVar3 / fVar2) * (fVar3 / fVar2) + 1.0;
            fVar3 = fVar2;
          }
        }
        x = x + (uint)incx;
        n = n + -1;
      } while (n != 0);
    }
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    fVar3 = fVar3 * fVar1;
  }
  return fVar3;
}

Assistant:

float snrm2 ( int n, float x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    SNRM2 returns the euclidean norm of a float vector.
//
//  Discussion:
//
//     SNRM2 ( X ) = sqrt ( X' * X )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 February 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, float X[*], the vector whose norm is to be computed.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Output, float SNRM2, the Euclidean norm of X.
//
{
  float absxi;
  int i;
  int ix;
  float norm;
  float scale;
  float ssq;

  if ( n < 1 || incx < 1 )
  {
    norm = 0.0;
  }
  else if ( n == 1 )
  {
    norm = fabs ( x[0] );
  }
  else
  {
    scale = 0.0;
    ssq = 1.0;
    ix = 0;

    for ( i = 0; i < n; i++ )
    {
      if ( x[ix] != 0.0 )
      {
        absxi = fabs ( x[ix] );
        if ( scale < absxi )
        {
          ssq = 1.0 + ssq * ( scale / absxi ) * ( scale / absxi );
          scale = absxi;
        }
        else
        {
          ssq = ssq + ( absxi / scale ) * ( absxi / scale );
        }
      }
      ix = ix + incx;
    }

    norm = scale * sqrt ( ssq );
  }

  return norm;
}